

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  CImgArgumentException *this_00;
  int iVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  int z;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int y;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  char *pcVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  uchar *puVar30;
  uchar *puVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  float fVar35;
  CImg<unsigned_char> local_58;
  long local_38;
  
  puVar12 = this->_data;
  uVar32 = this->_width;
  uVar1 = this->_height;
  uVar2 = this->_depth;
  uVar3 = this->_spectrum;
  if (((uVar3 != 0 && ((uVar2 != 0 && uVar1 != 0) && (uVar32 != 0 && puVar12 != (uchar *)0x0))) &&
      (puVar30 = sprite->_data, puVar30 != (uchar *)0x0)) &&
     (puVar9 = mask->_data, puVar9 != (uchar *)0x0)) {
    uVar20 = (ulong)uVar32;
    local_38 = uVar1 * uVar20;
    uVar4 = sprite->_width;
    uVar24 = (ulong)uVar4;
    uVar5 = sprite->_height;
    uVar6 = sprite->_depth;
    uVar7 = sprite->_spectrum;
    if ((puVar30 < puVar12 + local_38 * (ulong)uVar2 * (ulong)uVar3) &&
       (puVar12 < puVar30 + (ulong)uVar6 * (ulong)uVar7 * uVar5 * uVar24)) {
      CImg(&local_58,sprite,false);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,&local_58,mask,opacity,mask_max_value);
    }
    else {
      uVar8 = mask->_spectrum;
      if ((puVar12 + local_38 * (ulong)uVar2 * (ulong)uVar3 <= puVar9) ||
         (puVar9 + (ulong)mask->_depth * (ulong)uVar8 * (ulong)mask->_height * (ulong)mask->_width
          <= puVar12)) {
        if (((mask->_width != uVar4) || (mask->_height != uVar5)) || (mask->_depth != uVar6)) {
          this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
          pcVar26 = "non-";
          if (this->_is_shared != false) {
            pcVar26 = "";
          }
          CImgArgumentException::CImgArgumentException
                    (this_00,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                     ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                     (ulong)this->_spectrum,this->_data,pcVar26,"unsigned char",
                     (ulong)sprite->_width,(ulong)sprite->_height,(ulong)sprite->_depth,
                     (ulong)sprite->_spectrum,sprite->_data,(ulong)mask->_width,(ulong)mask->_height
                     ,(ulong)mask->_depth,(ulong)mask->_spectrum,mask->_data);
          __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
        }
        iVar19 = uVar32 - (uVar4 + x0);
        if ((int)(uVar4 + x0) <= (int)uVar32) {
          iVar19 = 0;
        }
        uVar32 = x0 >> 0x1f & x0;
        iVar19 = iVar19 + uVar4 + uVar32;
        iVar21 = uVar1 - (uVar5 + y0);
        if ((int)(uVar5 + y0) <= (int)uVar1) {
          iVar21 = 0;
        }
        iVar33 = uVar2 - (z0 + uVar6);
        if ((int)(z0 + uVar6) <= (int)uVar2) {
          iVar33 = 0;
        }
        iVar27 = uVar3 - (uVar7 + c0);
        if ((int)(uVar7 + c0) <= (int)uVar3) {
          iVar27 = 0;
        }
        if (iVar19 < 1) {
          return this;
        }
        iVar21 = (y0 >> 0x1f & y0) + uVar5 + iVar21;
        if (iVar21 < 1) {
          return this;
        }
        iVar33 = (z0 >> 0x1f & z0) + uVar6 + iVar33;
        if (iVar33 < 1) {
          return this;
        }
        iVar27 = uVar7 + (c0 >> 0x1f & c0) + iVar27;
        if (iVar27 < 1) {
          return this;
        }
        iVar10 = uVar6 * uVar5 * uVar4;
        lVar16 = (long)iVar19;
        iVar22 = -((z0 >> 0x1f & uVar5 * uVar4 * z0) + uVar32 + (y0 >> 0x1f & uVar4 * y0) +
                  (c0 >> 0x1f & iVar10 * c0));
        puVar9 = puVar9 + iVar22;
        puVar30 = puVar30 + iVar22;
        uVar25 = (ulong)(uint)x0;
        if (x0 < 1) {
          uVar25 = 0;
        }
        uVar15 = (ulong)(uint)y0;
        if (y0 < 1) {
          uVar15 = 0;
        }
        uVar28 = (ulong)(uint)z0;
        if (z0 < 1) {
          uVar28 = 0;
        }
        iVar22 = 0;
        uVar18 = (ulong)(uint)c0;
        if (c0 < 1) {
          uVar18 = 0;
        }
        puVar12 = puVar12 + local_38 * (ulong)uVar2 * uVar18 +
                            local_38 * uVar28 + uVar15 * uVar20 + uVar25;
        lVar17 = ((ulong)(uVar6 - iVar33) * (ulong)uVar5 + (ulong)(uVar5 - iVar21) + 1) * uVar24 -
                 lVar16;
        lVar34 = ((ulong)(uVar5 - iVar21) + 1) * uVar24 - lVar16;
        do {
          puVar11 = mask->_data + ((long)puVar9 - (long)mask->_data) % (long)(int)(uVar8 * iVar10);
          iVar14 = 0;
          do {
            iVar23 = 0;
            do {
              puVar31 = puVar30;
              puVar13 = puVar12;
              puVar9 = puVar11;
              lVar29 = 0;
              do {
                fVar35 = (float)puVar9[lVar29] * opacity;
                puVar13[lVar29] =
                     (uchar)(int)(((float)puVar31[lVar29] * ABS(fVar35) +
                                  (float)puVar13[lVar29] *
                                  (mask_max_value - (float)(-(uint)(0.0 <= fVar35) & (uint)fVar35)))
                                 / mask_max_value);
                lVar29 = lVar29 + 1;
              } while ((int)lVar29 < iVar19);
              iVar23 = iVar23 + 1;
              puVar11 = puVar9 + lVar29 + (uVar24 - lVar16);
              puVar12 = puVar13 + lVar29 + (uVar20 - lVar16);
              puVar30 = puVar31 + lVar29 + (uVar24 - lVar16);
            } while (iVar23 < iVar21);
            puVar12 = puVar13 + lVar29 + (((ulong)(uVar1 - iVar21) + 1) * uVar20 - lVar16);
            puVar30 = puVar31 + lVar29 + lVar34;
            puVar11 = puVar9 + lVar29 + lVar34;
            iVar14 = iVar14 + 1;
          } while (iVar14 < iVar33);
          puVar12 = puVar13 + lVar29 + (((ulong)uVar1 * (ulong)(uVar2 - iVar33) +
                                         (ulong)(uVar1 - iVar21) + 1) * uVar20 - lVar16);
          puVar30 = puVar31 + lVar29 + lVar17;
          puVar9 = puVar9 + lVar29 + lVar17;
          iVar22 = iVar22 + 1;
        } while (iVar22 < iVar27);
        return this;
      }
      CImg(&local_58,mask,false);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,sprite,&local_58,opacity,mask_max_value);
    }
    if ((local_58._is_shared == false) && (local_58._data != (uchar *)0x0)) {
      operator_delete__(local_58._data);
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask))   return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const int
        coff = -(bx?x0:0)-(by?y0*mask.width():0)-(bz?z0*mask.width()*mask.height():0)-(bc?c0*mask.width()*mask.height()*mask.depth():0),
        ssize = mask.width()*mask.height()*mask.depth()*mask.spectrum();
      const ti *ptrs = sprite._data + coff;
      const tm *ptrm = mask._data   + coff;
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
	T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int c = 0; c<lC; ++c) {
          ptrm = mask._data + (ptrm - mask._data)%ssize;
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              for (int x = 0; x<lX; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - cimg::max(mopacity,0);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
              ptrd+=offX; ptrs+=soffX; ptrm+=soffX;
            }
            ptrd+=offY; ptrs+=soffY; ptrm+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ; ptrm+=soffZ;
        }
      }
      return *this;
    }